

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O2

void monster_take_terrain_damage(monster_conflict *mon)

{
  _Bool _Var1;
  uint32_t uVar2;
  
  _Var1 = square_isfiery(cave,mon->grid);
  if (_Var1) {
    _Var1 = flag_has_dbg(mon->race->flags,0xb,0x47,"mon->race->flags","RF_IM_FIRE");
    if (!_Var1) {
      uVar2 = Rand_div(100);
      mon_take_nonplayer_hit(uVar2 + L'e',mon,MON_MSG_CATCH_FIRE,MON_MSG_DISINTEGRATES);
      return;
    }
  }
  return;
}

Assistant:

void monster_take_terrain_damage(struct monster *mon)
{
	/* Damage the monster */
	if (square_isfiery(cave, mon->grid)) {
		bool fear = false;

		if (!rf_has(mon->race->flags, RF_IM_FIRE)) {
			mon_take_nonplayer_hit(100 + randint1(100), mon, MON_MSG_CATCH_FIRE,
								   MON_MSG_DISINTEGRATES);
		}

		if (fear && monster_is_visible(mon)) {
			add_monster_message(mon, MON_MSG_FLEE_IN_TERROR, true);
		}
	}	
}